

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O2

void __thiscall KDReports::Test::testEndlessPrinterBug(Test *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  AutoTableElement tableElement;
  QSqlDatabase db;
  QSqlTableModel tableModel;
  QSqlQuery query;
  Report report;
  QLatin1String local_50;
  undefined4 local_40;
  undefined2 local_3c;
  undefined8 local_3a;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  QString::QString((QString *)&tableElement,"QSQLITE");
  QLatin1String::QLatin1String(&local_50,QSqlDatabase::defaultConnection);
  QString::QString((QString *)&tableModel,local_50);
  QSqlDatabase::addDatabase((QString *)&db,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableModel);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QString::QString((QString *)&tableElement,":memory:");
  QSqlDatabase::setDatabaseName((QString *)&db);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  bVar1 = (bool)QSqlDatabase::open();
  cVar2 = QTest::qVerify(bVar1,"db.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                         ,0x73);
  if (cVar2 != '\0') {
    _tableElement = (Data *)0x0;
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)&tableModel);
    QSqlQuery::QSqlQuery(&query,(QString *)&tableElement,(QSqlDatabase *)&tableModel);
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&tableModel);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
    QString::QString((QString *)&tableElement,
                     "create table airlines (id int primary key, name varchar(20), homecountry varchar(2))"
                    );
    QSqlQuery::exec((QString *)&query);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
    for (iVar3 = 0; iVar3 != 500; iVar3 = iVar3 + 1) {
      QString::QString((QString *)&tableModel,"insert into airlines values(%0, \'Test%0\', \'T%0\')"
                      );
      QString::arg((QString *)&tableElement,(QString *)&tableModel,iVar3,0,10,(QChar)0x20);
      QSqlQuery::exec((QString *)&query);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableModel);
    }
    QSqlTableModel::QSqlTableModel(&tableModel,(QObject *)0x0,&db);
    QString::QString((QString *)&tableElement,"airlines");
    QSqlTableModel::setTable((QString *)&tableModel);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
    QSqlTableModel::select();
    KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&tableModel);
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
    local_40 = 0;
    local_3c = 0xffff;
    local_3a = 0;
    KDReports::Report::addElement(&report,&tableElement,1);
    KDReports::Report::setWidthForEndlessPrinter(105.0);
    iVar3 = KDReports::Report::numberOfPages();
    QTest::qCompare(iVar3,1,"report.numberOfPages()","1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                    ,0x86);
    KDReports::AutoTableElement::~AutoTableElement(&tableElement);
    QSqlTableModel::~QSqlTableModel(&tableModel);
    QSqlQuery::~QSqlQuery(&query);
  }
  QSqlDatabase::~QSqlDatabase(&db);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testEndlessPrinterBug()
    {
        KDReports::Report report;
        QSqlDatabase db = QSqlDatabase::addDatabase("QSQLITE");
        db.setDatabaseName(":memory:");
        QVERIFY(db.open());

        // fill the DB with some test data
        QSqlQuery query;
        query.exec("create table airlines (id int primary key, "
                   "name varchar(20), homecountry varchar(2))");
        for (int i = 0; i < 500; i++)
            query.exec(QString("insert into airlines values(%0, 'Test%0', 'T%0')").arg(i));

        QSqlTableModel tableModel(nullptr, db);
        tableModel.setTable("airlines");
        tableModel.select();

        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setVerticalHeaderVisible(false);
        report.addElement(tableElement);

        report.setWidthForEndlessPrinter(105.0);

        QCOMPARE(report.numberOfPages(), 1);
    }